

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int lyp_rfn_apply_ext(lys_module *module)

{
  lys_node *plVar1;
  ushort uVar2;
  int iVar3;
  LYS_NODE LVar4;
  lys_node **pplVar5;
  ly_set *set;
  lys_ext_instance **pplVar6;
  lys_node *plVar7;
  lys_node *plVar8;
  ulong uVar9;
  lys_node *plVar10;
  lys_node *node;
  lys_refine *rfn;
  ulong uVar11;
  lys_node *plVar12;
  ulong local_40;
  lys_node *local_38;
  lys_node *target;
  
  pplVar5 = &module->data;
  local_40 = 0;
  do {
    node = *pplVar5;
    do {
      do {
        if (node == (lys_node *)0x0) {
          return 0;
        }
        plVar1 = node->next;
        plVar10 = node;
LAB_00126b67:
        if (plVar10 != (lys_node *)0x0) {
          LVar4 = plVar10->nodetype;
          if (LVar4 == LYS_USES) {
            for (uVar11 = 0; uVar11 < plVar10->padding[2]; uVar11 = uVar11 + 1) {
              if (plVar10[1].name[uVar11 * 0x50 + 0x1a] != '\0') {
                local_38 = (lys_node *)0x0;
                rfn = (lys_refine *)(plVar10[1].name + uVar11 * 0x50);
                resolve_descendant_schema_nodeid(rfn->target_name,plVar10->child,0xc0ff,0,&local_38)
                ;
                if (local_38 == (lys_node *)0x0) {
                  ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                         ,0xc45);
                  return 1;
                }
                set = ly_set_new();
                iVar3 = -1;
                while (iVar3 = lys_ext_iter(rfn->ext,rfn->ext_size,(char)iVar3 + '\x01',
                                            LYEXT_SUBSTMT_SELF), iVar3 != -1) {
                  ly_set_add(set,rfn->ext[iVar3]->def,0);
                }
                uVar9 = 0;
                while (uVar9 < set->number) {
                  iVar3 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_SELF,
                                             (lys_ext *)(set->set).s[uVar9]);
                  uVar9 = uVar9 + 1;
                  if (iVar3 != 0) {
                    ly_set_free(set);
                    return 1;
                  }
                }
                ly_set_free(set);
                if ((rfn->dsc != (char *)0x0) &&
                   (iVar3 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_DESCRIPTION,(lys_ext *)0x0
                                              ), iVar3 != 0)) {
                  return 1;
                }
                if ((rfn->ref != (char *)0x0) &&
                   (iVar3 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_REFERENCE,(lys_ext *)0x0),
                   iVar3 != 0)) {
                  return 1;
                }
                if ((((rfn->flags & 3) != 0) && ((local_38->flags & 3) != 0)) &&
                   (iVar3 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_CONFIG,(lys_ext *)0x0),
                   iVar3 != 0)) {
                  return 1;
                }
                if ((rfn->dflt_size != '\0') &&
                   (iVar3 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_DEFAULT,(lys_ext *)0x0),
                   iVar3 != 0)) {
                  return 1;
                }
                if (((rfn->flags & 0xc0) != 0) &&
                   (iVar3 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_MANDATORY,(lys_ext *)0x0),
                   iVar3 != 0)) {
                  return 1;
                }
                if ((((local_38->nodetype & LYS_CONTAINER) != LYS_UNKNOWN) &&
                    ((rfn->mod).presence != (char *)0x0)) &&
                   (iVar3 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_PRESENCE,(lys_ext *)0x0),
                   iVar3 != 0)) {
                  return 1;
                }
                uVar2 = rfn->flags;
                if ((uVar2 & 0x10) != 0) {
                  iVar3 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_MIN,(lys_ext *)0x0);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  uVar2 = rfn->flags;
                }
                if (((uVar2 & 8) != 0) &&
                   (iVar3 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_MAX,(lys_ext *)0x0),
                   iVar3 != 0)) {
                  return 1;
                }
                if (local_38->ext_size != 0) {
                  pplVar6 = (lys_ext_instance **)
                            realloc(local_38->ext,(ulong)local_38->ext_size << 3);
                  local_38->ext = pplVar6;
                }
              }
            }
            LVar4 = plVar10->nodetype;
          }
          plVar12 = plVar10;
          if (((LVar4 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
             (plVar7 = plVar10->child, plVar10->child != (lys_node *)0x0)) goto LAB_00126dae;
          if (plVar10 == node) goto LAB_00126df0;
          do {
            plVar7 = plVar12->next;
LAB_00126dae:
            plVar10 = plVar7;
            if (plVar10 != (lys_node *)0x0) break;
            plVar12 = plVar12->parent;
            if (plVar12->nodetype == LYS_AUGMENT) {
              plVar12 = plVar12->prev;
            }
            plVar7 = lys_parent(plVar12);
            plVar8 = lys_parent(node);
          } while (plVar7 != plVar8);
          goto LAB_00126b67;
        }
LAB_00126df0:
        node = plVar1;
      } while (plVar1 != (lys_node *)0x0);
      node = (lys_node *)0x0;
    } while (module->augment_size <= (uint)local_40);
    pplVar5 = &module->augment[local_40].child;
    local_40 = (ulong)((uint)local_40 + 1);
  } while( true );
}

Assistant:

int
lyp_rfn_apply_ext(struct lys_module *module)
{
    int i, k, a = 0;
    struct lys_node *root, *nextroot, *next, *node;
    struct lys_node *target;
    struct lys_node_uses *uses;
    struct lys_refine *rfn;
    struct ly_set *extset;

    /* refines in uses */
    LY_TREE_FOR_SAFE(module->data, nextroot, root) {
        /* go through the data tree of the module and all the defined augments */

        LY_TREE_DFS_BEGIN(root, next, node) {
            if (node->nodetype == LYS_USES) {
                uses = (struct lys_node_uses *)node;

                for (i = 0; i < uses->refine_size; i++) {
                    if (!uses->refine[i].ext_size) {
                        /* no extensions in refine */
                        continue;
                    }
                    rfn = &uses->refine[i]; /* shortcut */

                    /* get the target node */
                    target = NULL;
                    resolve_descendant_schema_nodeid(rfn->target_name, uses->child,
                                                     LYS_NO_RPC_NOTIF_NODE | LYS_ACTION | LYS_NOTIF,
                                                     0, (const struct lys_node **)&target);
                    if (!target) {
                        /* it should always succeed since the target_name was already resolved at least
                         * once when the refine itself was being resolved */
                        LOGINT(module->ctx);;
                        return EXIT_FAILURE;
                    }

                    /* extensions */
                    extset = ly_set_new();
                    k = -1;
                    while ((k = lys_ext_iter(rfn->ext, rfn->ext_size, k + 1, LYEXT_SUBSTMT_SELF)) != -1) {
                        ly_set_add(extset, rfn->ext[k]->def, 0);
                    }
                    for (k = 0; (unsigned int)k < extset->number; k++) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_SELF, (struct lys_ext *)extset->set.g[k])) {
                            ly_set_free(extset);
                            return EXIT_FAILURE;
                        }
                    }
                    ly_set_free(extset);

                    /* description */
                    if (rfn->dsc && lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_DESCRIPTION, NULL)) {
                        return EXIT_FAILURE;
                    }
                    /* reference */
                    if (rfn->ref && lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_REFERENCE, NULL)) {
                        return EXIT_FAILURE;
                    }
                    /* config, in case of notification or rpc/action{notif, the config is not applicable
                     * (there is no config status) */
                    if ((rfn->flags & LYS_CONFIG_MASK) && (target->flags & LYS_CONFIG_MASK)) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_CONFIG, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* default value */
                    if (rfn->dflt_size && lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_DEFAULT, NULL)) {
                        return EXIT_FAILURE;
                    }
                    /* mandatory */
                    if (rfn->flags & LYS_MAND_MASK) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_MANDATORY, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* presence */
                    if ((target->nodetype & LYS_CONTAINER) && rfn->mod.presence) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_PRESENCE, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* min/max */
                    if (rfn->flags & LYS_RFN_MINSET) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_MIN, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    if (rfn->flags & LYS_RFN_MAXSET) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_MAX, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* must and if-feature contain extensions on their own, not needed to be solved here */

                    if (target->ext_size) {
                        /* the allocated target's extension array can be now longer than needed in case
                         * there is less refine substatement's extensions than in original. Since we are
                         * going to reduce or keep the same memory, it is not necessary to test realloc's result */
                        target->ext = realloc(target->ext, target->ext_size * sizeof *target->ext);
                    }
                }
            }
            LY_TREE_DFS_END(root, next, node)
        }

        if (!nextroot && a < module->augment_size) {
            nextroot = module->augment[a].child;
            a++;
        }
    }

    return EXIT_SUCCESS;
}